

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXMLParser.cxx
# Opt level: O0

int testXMLParser(int param_1,char **param_2)

{
  int iVar1;
  ostream *this;
  undefined1 local_40 [8];
  cmXMLParser parser;
  char **param_1_local;
  int param_0_local;
  
  parser.Parser = param_2;
  cmXMLParser::cmXMLParser((cmXMLParser *)local_40);
  iVar1 = cmXMLParser::ParseFile
                    ((cmXMLParser *)local_40,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Tests/CMakeLib/testXMLParser.xml"
                    );
  if (iVar1 == 0) {
    this = std::operator<<((ostream *)&std::cerr,"cmXMLParser failed!");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  param_1_local._4_4_ = (uint)(iVar1 == 0);
  cmXMLParser::~cmXMLParser((cmXMLParser *)local_40);
  return param_1_local._4_4_;
}

Assistant:

int testXMLParser(int, char*[])
{
  // TODO: Derive from parser and check attributes.
  cmXMLParser parser;
  if(!parser.ParseFile(SOURCE_DIR "/testXMLParser.xml"))
    {
    cmsys_ios::cerr << "cmXMLParser failed!" << cmsys_ios::endl;
    return 1;
    }
  return 0;
}